

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-test-compare.cc
# Opt level: O0

void cleanTrailer(QPDFObjectHandle *trailer)

{
  byte bVar1;
  __type _Var2;
  int iVar3;
  QPDFObjectHandle local_100;
  QPDFObjectHandle local_f0;
  QPDFObjectHandle local_e0;
  undefined1 local_d0 [8];
  string id1;
  undefined1 local_a0 [8];
  string id0;
  string local_78 [32];
  undefined1 local_58 [8];
  QPDFObjectHandle id;
  allocator<char> local_31;
  string local_30 [32];
  QPDFObjectHandle *local_10;
  QPDFObjectHandle *trailer_local;
  
  local_10 = trailer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"/Length",&local_31);
  QPDFObjectHandle::removeKey((string *)trailer);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"/ID",(allocator<char> *)(id0.field_2._M_local_buf + 0xf));
  QPDFObjectHandle::getKey((string *)local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)(id0.field_2._M_local_buf + 0xf));
  bVar1 = QPDFObjectHandle::isArray();
  if (((bVar1 & 1) != 0) && (iVar3 = QPDFObjectHandle::getArrayNItems(), iVar3 == 2)) {
    QPDFObjectHandle::getArrayItem((int)&id1 + 0x18);
    QPDFObjectHandle::unparse_abi_cxx11_();
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&id1.field_2 + 8));
    QPDFObjectHandle::getArrayItem((int)&local_e0);
    QPDFObjectHandle::unparse_abi_cxx11_();
    QPDFObjectHandle::~QPDFObjectHandle(&local_e0);
    operator____qpdf((char *)&local_f0,0x109319);
    QPDFObjectHandle::setArrayItem((int)local_58,(QPDFObjectHandle *)0x1);
    QPDFObjectHandle::~QPDFObjectHandle(&local_f0);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_d0);
    if (_Var2) {
      operator____qpdf((char *)&local_100,0x109319);
      QPDFObjectHandle::setArrayItem((int)local_58,(QPDFObjectHandle *)0x0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_100);
    }
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_a0);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_58);
  return;
}

Assistant:

void
cleanTrailer(QPDFObjectHandle& trailer)
{
    // If the trailer is an object stream, it will have /Length.
    trailer.removeKey("/Length");
    // Disregard the second half of /ID. This doesn't have anything directly to do with zlib, but
    // lots of tests use --deterministic-id, and that is affected. The deterministic ID tests
    // meaningfully exercise that deterministic IDs behave as expected, so for the rest of the
    // tests, it's okay to ignore /ID[1]. If the two halves of /ID are the same, ignore both since
    // this means qpdf completely generated the /ID rather than preserving the first half.
    auto id = trailer.getKey("/ID");
    if (id.isArray() && id.getArrayNItems() == 2) {
        auto id0 = id.getArrayItem(0).unparse();
        auto id1 = id.getArrayItem(1).unparse();
        id.setArrayItem(1, "()"_qpdf);
        if (id0 == id1) {
            id.setArrayItem(0, "()"_qpdf);
        }
    }
}